

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O2

void __thiscall
cmFindPackageCommand::SetVersionVariables
          (cmFindPackageCommand *this,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *addDefinition,string *prefix,string *version,uint count,uint major,uint minor,uint patch,
          uint tweak)

{
  size_t sVar1;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  basic_string_view<char,_std::char_traits<char>_> __args_1_01;
  basic_string_view<char,_std::char_traits<char>_> __args_1_02;
  basic_string_view<char,_std::char_traits<char>_> __args_1_03;
  basic_string_view<char,_std::char_traits<char>_> __args_1_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_88;
  char buf [64];
  
  __args_1._M_str = (version->_M_dataplus)._M_p;
  __args_1._M_len = version->_M_string_length;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,prefix,__args_1);
  snprintf(buf,0x40,"%u",(ulong)major);
  std::operator+(&bStack_88,prefix,"_MAJOR");
  sVar1 = strlen(buf);
  __args_1_00._M_str = buf;
  __args_1_00._M_len = sVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&bStack_88,__args_1_00);
  std::__cxx11::string::~string((string *)&bStack_88);
  snprintf(buf,0x40,"%u",(ulong)minor);
  std::operator+(&bStack_88,prefix,"_MINOR");
  sVar1 = strlen(buf);
  __args_1_01._M_str = buf;
  __args_1_01._M_len = sVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&bStack_88,__args_1_01);
  std::__cxx11::string::~string((string *)&bStack_88);
  snprintf(buf,0x40,"%u",(ulong)patch);
  std::operator+(&bStack_88,prefix,"_PATCH");
  sVar1 = strlen(buf);
  __args_1_02._M_str = buf;
  __args_1_02._M_len = sVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&bStack_88,__args_1_02);
  std::__cxx11::string::~string((string *)&bStack_88);
  snprintf(buf,0x40,"%u",(ulong)tweak);
  std::operator+(&bStack_88,prefix,"_TWEAK");
  sVar1 = strlen(buf);
  __args_1_03._M_str = buf;
  __args_1_03._M_len = sVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&bStack_88,__args_1_03);
  std::__cxx11::string::~string((string *)&bStack_88);
  snprintf(buf,0x40,"%u",(ulong)count);
  std::operator+(&bStack_88,prefix,"_COUNT");
  sVar1 = strlen(buf);
  __args_1_04._M_str = buf;
  __args_1_04._M_len = sVar1;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator()(addDefinition,&bStack_88,__args_1_04);
  std::__cxx11::string::~string((string *)&bStack_88);
  return;
}

Assistant:

void cmFindPackageCommand::SetVersionVariables(
  const std::function<void(const std::string&, cm::string_view)>&
    addDefinition,
  const std::string& prefix, const std::string& version,
  const unsigned int count, const unsigned int major, const unsigned int minor,
  const unsigned int patch, const unsigned int tweak)
{
  addDefinition(prefix, version);

  char buf[64];
  snprintf(buf, sizeof(buf), "%u", major);
  addDefinition(prefix + "_MAJOR", buf);
  snprintf(buf, sizeof(buf), "%u", minor);
  addDefinition(prefix + "_MINOR", buf);
  snprintf(buf, sizeof(buf), "%u", patch);
  addDefinition(prefix + "_PATCH", buf);
  snprintf(buf, sizeof(buf), "%u", tweak);
  addDefinition(prefix + "_TWEAK", buf);
  snprintf(buf, sizeof(buf), "%u", count);
  addDefinition(prefix + "_COUNT", buf);
}